

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O2

void __thiscall
duckdb::TextTreeRenderer::RenderBoxContent
          (TextTreeRenderer *this,RenderTree *root,ostream *ss,idx_t y)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  RenderTreeNode *pRVar5;
  reference pvVar6;
  iterator iVar7;
  char **ppcVar8;
  ulong uVar9;
  string *this_00;
  ulong x_00;
  ulong x_01;
  idx_t x;
  ulong uVar10;
  optional_ptr<duckdb::RenderTreeNode,_true> node_1;
  string local_108;
  ulong local_e8;
  ulong local_e0;
  optional_ptr<duckdb::RenderTreeNode,_true> node;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  char **local_98;
  idx_t local_90;
  ulong local_88;
  ulong local_80;
  vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
  extra_info;
  string local_50;
  
  extra_info.
  super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  extra_info.
  super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  extra_info.
  super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
  ::resize(&extra_info.
            super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
           ,root->width);
  local_e8 = 0;
  for (uVar10 = 0; uVar10 < root->width; uVar10 = uVar10 + 1) {
    node = RenderTree::GetNode(root,uVar10,y);
    if (node.ptr != (RenderTreeNode *)0x0) {
      pRVar5 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->(&node);
      pvVar6 = vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
               ::get<true>(&extra_info,uVar10);
      SplitUpExtraInfo(this,&pRVar5->extra_text,pvVar6,(this->config).max_extra_lines);
      pvVar6 = vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
               ::get<true>(&extra_info,uVar10);
      if (local_e8 <
          (ulong)((long)(pvVar6->
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar6->
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        pvVar6 = vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                 ::get<true>(&extra_info,uVar10);
        local_e8 = (long)(pvVar6->
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar6->
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
      }
    }
  }
  local_80 = local_e8 + 1 >> 1;
  local_98 = &(this->config).VERTICAL;
  local_90 = y + 1;
  uVar10 = 0;
  do {
    if (local_e8 < uVar10) {
      ::std::
      vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
      ::~vector(&extra_info.
                 super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
               );
      return;
    }
    local_88 = uVar10 + 1;
    x_01 = 0;
    local_e0 = uVar10;
    while( true ) {
      uVar9 = root->width;
      if ((uVar9 <= x_01) ||
         ((this->config).maximum_render_width <= (this->config).node_render_width * x_01)) break;
      bVar4 = false;
      for (x_00 = x_01; x_00 < uVar9; x_00 = x_00 + 1) {
        bVar2 = true;
        if (bVar4 == false) {
          bVar2 = RenderTree::HasNode(root,x_00,y);
          uVar9 = root->width;
        }
        bVar4 = bVar2;
      }
      node_1 = RenderTree::GetNode(root,x_01,y);
      if (node_1.ptr == (RenderTreeNode *)0x0) {
        if (local_e0 == local_80) {
          bVar2 = ShouldRenderWhitespace(root,x_01,y);
          bVar3 = RenderTree::HasNode(root,x_01,local_90);
          if (bVar3) {
            ::std::__cxx11::string::string
                      ((string *)&local_108,(this->config).HORIZONTAL,(allocator *)&local_b8);
            StringUtil::Repeat((string *)&node,&local_108,(this->config).node_render_width >> 1);
            ::std::operator<<(ss,(string *)&node);
            ::std::__cxx11::string::~string((string *)&node);
            ::std::__cxx11::string::~string((string *)&local_108);
            if (bVar2) {
              ::std::operator<<(ss,(this->config).TMIDDLE);
              ::std::__cxx11::string::string
                        ((string *)&local_108,(this->config).HORIZONTAL,(allocator *)&local_b8);
              StringUtil::Repeat((string *)&node,&local_108,(this->config).node_render_width >> 1);
              ::std::operator<<(ss,(string *)&node);
            }
            else {
              ::std::operator<<(ss,(this->config).RTCORNER);
              if (bVar4 == false) goto LAB_01673834;
              ::std::__cxx11::string::string((string *)&local_108," ",(allocator *)&local_b8);
              StringUtil::Repeat((string *)&node,&local_108,(this->config).node_render_width >> 1);
              ::std::operator<<(ss,(string *)&node);
            }
          }
          else if (bVar2) {
            ::std::__cxx11::string::string
                      ((string *)&local_108,(this->config).HORIZONTAL,(allocator *)&local_b8);
            StringUtil::Repeat((string *)&node,&local_108,(this->config).node_render_width);
            ::std::operator<<(ss,(string *)&node);
          }
          else {
            if (bVar4 == false) goto LAB_01673834;
            ::std::__cxx11::string::string((string *)&local_108," ",(allocator *)&local_b8);
            StringUtil::Repeat((string *)&node,&local_108,(this->config).node_render_width);
            ::std::operator<<(ss,(string *)&node);
          }
LAB_01673822:
          ::std::__cxx11::string::~string((string *)&node);
          this_00 = &local_108;
          goto LAB_0167382f;
        }
        if (local_e0 < local_80) {
          if (bVar4 == false) goto LAB_01673834;
          ::std::__cxx11::string::string((string *)&local_108," ",(allocator *)&local_b8);
          StringUtil::Repeat((string *)&node,&local_108,(this->config).node_render_width);
          ::std::operator<<(ss,(string *)&node);
          goto LAB_01673822;
        }
        bVar2 = RenderTree::HasNode(root,x_01,local_90);
        if (bVar2) {
          ::std::__cxx11::string::string((string *)&local_108," ",(allocator *)&local_b8);
          StringUtil::Repeat((string *)&node,&local_108,(this->config).node_render_width >> 1);
          ::std::operator<<(ss,(string *)&node);
          ::std::__cxx11::string::~string((string *)&node);
          ::std::__cxx11::string::~string((string *)&local_108);
          ::std::operator<<(ss,*local_98);
          if ((bVar4 != false) || (bVar4 = ShouldRenderWhitespace(root,x_01,y), bVar4)) {
            ::std::__cxx11::string::string((string *)&local_108," ",(allocator *)&local_b8);
            StringUtil::Repeat((string *)&node,&local_108,(this->config).node_render_width >> 1);
            ::std::operator<<(ss,(string *)&node);
            goto LAB_01673822;
          }
        }
        else if ((bVar4 != false) || (bVar4 = ShouldRenderWhitespace(root,x_01,y), bVar4)) {
          ::std::__cxx11::string::string((string *)&local_108," ",(allocator *)&local_b8);
          StringUtil::Repeat((string *)&node,&local_108,(this->config).node_render_width);
          ::std::operator<<(ss,(string *)&node);
          goto LAB_01673822;
        }
      }
      else {
        ::std::operator<<(ss,*local_98);
        node.ptr = (RenderTreeNode *)&local_c8;
        local_c8._M_local_buf[0] = '\0';
        if (local_e0 == 0) {
          optional_ptr<duckdb::RenderTreeNode,_true>::operator->(&node_1);
LAB_0167324c:
          ::std::__cxx11::string::_M_assign((string *)&node);
        }
        else {
          pvVar6 = vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                   ::get<true>(&extra_info,x_01);
          if (local_e0 <=
              (ulong)((long)(pvVar6->
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar6->
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5)) {
            pvVar6 = vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                     ::get<true>(&extra_info,x_01);
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ::get<true>(pvVar6,uVar10 - 1);
            goto LAB_0167324c;
          }
        }
        if (local_88 == local_e8) {
          pRVar5 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->(&node_1);
          ::std::__cxx11::string::string
                    ((string *)&local_108,"__cardinality__",(allocator *)&local_b8);
          iVar7 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::find(&pRVar5->extra_text,(string *)&local_108);
          ::std::__cxx11::string::~string((string *)&local_108);
          pRVar5 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->(&node_1);
          if (iVar7._M_current !=
              (pRVar5->extra_text).map.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_108,&(iVar7._M_current)->second," Rows");
            ::std::__cxx11::string::operator=((string *)&node,(string *)&local_108);
            ::std::__cxx11::string::~string((string *)&local_108);
          }
        }
        if (local_e0 == local_e8) {
          pRVar5 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->(&node_1);
          ::std::__cxx11::string::string((string *)&local_108,"__timing__",(allocator *)&local_b8);
          iVar7 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::find(&pRVar5->extra_text,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_108);
          ::std::__cxx11::string::~string((string *)&local_108);
          pRVar5 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->(&node_1);
          if (iVar7._M_current ==
              (pRVar5->extra_text).map.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pRVar5 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->(&node_1);
            ::std::__cxx11::string::string
                      ((string *)&local_108,"__cardinality__",(allocator *)&local_b8);
            iVar7 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::find(&pRVar5->extra_text,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_108);
            pRVar5 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->(&node_1);
            ppVar1 = (pRVar5->extra_text).map.
                     super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            ::std::__cxx11::string::~string((string *)&local_108);
            if (iVar7._M_current == ppVar1) {
              pRVar5 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->(&node_1);
              ::std::__cxx11::string::string
                        ((string *)&local_108,"__estimated_cardinality__",(allocator *)&local_b8);
              iVar7 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::find(&pRVar5->extra_text,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_108);
              ::std::__cxx11::string::~string((string *)&local_108);
              pRVar5 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->(&node_1);
              if (iVar7._M_current !=
                  (pRVar5->extra_text).map.
                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  .
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                ::std::operator+(&local_b8,"~",&(iVar7._M_current)->second);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_108,&local_b8," Rows");
                goto LAB_0167338b;
              }
            }
          }
          else {
            ::std::operator+(&local_b8,"(",&(iVar7._M_current)->second);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_108,&local_b8,")");
LAB_0167338b:
            ::std::__cxx11::string::operator=((string *)&node,(string *)&local_108);
            ::std::__cxx11::string::~string((string *)&local_108);
            ::std::__cxx11::string::~string((string *)&local_b8);
          }
          pRVar5 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->(&node_1);
          ::std::__cxx11::string::string
                    ((string *)&local_108,"__cardinality__",(allocator *)&local_b8);
          iVar7 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::find(&pRVar5->extra_text,(string *)&local_108);
          pRVar5 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->(&node_1);
          ppVar1 = (pRVar5->extra_text).map.
                   super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   .
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          ::std::__cxx11::string::~string((string *)&local_108);
          if (iVar7._M_current == ppVar1) {
            pRVar5 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->(&node_1);
            ::std::__cxx11::string::string
                      ((string *)&local_108,"__estimated_cardinality__",(allocator *)&local_b8);
            iVar7 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::find(&pRVar5->extra_text,(string *)&local_108);
            ::std::__cxx11::string::~string((string *)&local_108);
            pRVar5 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->(&node_1);
            if (iVar7._M_current !=
                (pRVar5->extra_text).map.
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              ::std::operator+(&local_b8,"~",&(iVar7._M_current)->second);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_108,&local_b8," Rows");
              ::std::__cxx11::string::operator=((string *)&node,(string *)&local_108);
              ::std::__cxx11::string::~string((string *)&local_108);
              ::std::__cxx11::string::~string((string *)&local_b8);
            }
          }
        }
        this_00 = (string *)&node;
        ::std::__cxx11::string::string((string *)&local_50,(string *)this_00);
        AdjustTextForRendering((string *)&local_108,&local_50,(this->config).node_render_width - 2);
        ::std::__cxx11::string::operator=((string *)this_00,(string *)&local_108);
        ::std::__cxx11::string::~string((string *)&local_108);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::operator<<(ss,(string *)this_00);
        if ((local_e0 != local_80) ||
           (pRVar5 = optional_ptr<duckdb::RenderTreeNode,_true>::operator*(&node_1),
           ppcVar8 = &(this->config).LMIDDLE,
           (ulong)((long)(pRVar5->child_positions).
                         super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                         .
                         super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pRVar5->child_positions).
                        super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                        .
                        super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                        ._M_impl.super__Vector_impl_data._M_start) < 0x11)) {
          ppcVar8 = local_98;
        }
        ::std::operator<<(ss,*ppcVar8);
LAB_0167382f:
        ::std::__cxx11::string::~string((string *)this_00);
      }
LAB_01673834:
      x_01 = x_01 + 1;
    }
    ::std::operator<<(ss,'\n');
    uVar10 = local_88;
  } while( true );
}

Assistant:

void TextTreeRenderer::RenderBoxContent(RenderTree &root, std::ostream &ss, idx_t y) {
	// we first need to figure out how high our boxes are going to be
	vector<vector<string>> extra_info;
	idx_t extra_height = 0;
	extra_info.resize(root.width);
	for (idx_t x = 0; x < root.width; x++) {
		auto node = root.GetNode(x, y);
		if (node) {
			SplitUpExtraInfo(node->extra_text, extra_info[x], config.max_extra_lines);
			if (extra_info[x].size() > extra_height) {
				extra_height = extra_info[x].size();
			}
		}
	}
	idx_t halfway_point = (extra_height + 1) / 2;
	// now we render the actual node
	for (idx_t render_y = 0; render_y <= extra_height; render_y++) {
		for (idx_t x = 0; x < root.width; x++) {
			if (x * config.node_render_width >= config.maximum_render_width) {
				break;
			}
			bool has_adjacent_nodes = false;
			for (idx_t i = 0; x + i < root.width; i++) {
				has_adjacent_nodes = has_adjacent_nodes || root.HasNode(x + i, y);
			}
			auto node = root.GetNode(x, y);
			if (!node) {
				if (render_y == halfway_point) {
					bool has_child_to_the_right = ShouldRenderWhitespace(root, x, y);
					if (root.HasNode(x, y + 1)) {
						// node right below this one
						ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width / 2);
						if (has_child_to_the_right) {
							ss << config.TMIDDLE;
							// but we have another child to the right! keep rendering the line
							ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width / 2);
						} else {
							ss << config.RTCORNER;
							if (has_adjacent_nodes) {
								// only a child below this one: fill the rest with spaces
								ss << StringUtil::Repeat(" ", config.node_render_width / 2);
							}
						}
					} else if (has_child_to_the_right) {
						// child to the right, but no child right below this one: render a full line
						ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width);
					} else {
						if (has_adjacent_nodes) {
							// empty spot: render spaces
							ss << StringUtil::Repeat(" ", config.node_render_width);
						}
					}
				} else if (render_y >= halfway_point) {
					if (root.HasNode(x, y + 1)) {
						// we have a node below this empty spot: render a vertical line
						ss << StringUtil::Repeat(" ", config.node_render_width / 2);
						ss << config.VERTICAL;
						if (has_adjacent_nodes || ShouldRenderWhitespace(root, x, y)) {
							ss << StringUtil::Repeat(" ", config.node_render_width / 2);
						}
					} else {
						if (has_adjacent_nodes || ShouldRenderWhitespace(root, x, y)) {
							// empty spot: render spaces
							ss << StringUtil::Repeat(" ", config.node_render_width);
						}
					}
				} else {
					if (has_adjacent_nodes) {
						// empty spot: render spaces
						ss << StringUtil::Repeat(" ", config.node_render_width);
					}
				}
			} else {
				ss << config.VERTICAL;
				// figure out what to render
				string render_text;
				if (render_y == 0) {
					render_text = node->name;
				} else {
					if (render_y <= extra_info[x].size()) {
						render_text = extra_info[x][render_y - 1];
					}
				}
				if (render_y + 1 == extra_height && render_text.empty()) {
					auto entry = node->extra_text.find(RenderTreeNode::CARDINALITY);
					if (entry != node->extra_text.end()) {
						render_text = entry->second + " Rows";
					}
				}
				if (render_y == extra_height && render_text.empty()) {
					auto timing_entry = node->extra_text.find(RenderTreeNode::TIMING);
					if (timing_entry != node->extra_text.end()) {
						render_text = "(" + timing_entry->second + ")";
					} else if (node->extra_text.find(RenderTreeNode::CARDINALITY) == node->extra_text.end()) {
						// we only render estimated cardinality if there is no real cardinality
						auto entry = node->extra_text.find(RenderTreeNode::ESTIMATED_CARDINALITY);
						if (entry != node->extra_text.end()) {
							render_text = "~" + entry->second + " Rows";
						}
					}
					if (node->extra_text.find(RenderTreeNode::CARDINALITY) == node->extra_text.end()) {
						// we only render estimated cardinality if there is no real cardinality
						auto entry = node->extra_text.find(RenderTreeNode::ESTIMATED_CARDINALITY);
						if (entry != node->extra_text.end()) {
							render_text = "~" + entry->second + " Rows";
						}
					}
				}
				render_text = AdjustTextForRendering(render_text, config.node_render_width - 2);
				ss << render_text;

				if (render_y == halfway_point && NodeHasMultipleChildren(*node)) {
					ss << config.LMIDDLE;
				} else {
					ss << config.VERTICAL;
				}
			}
		}
		ss << '\n';
	}
}